

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O1

bool __thiscall cmCTestMultiProcessHandler::StartTest(cmCTestMultiProcessHandler *this,int test)

{
  mapped_type *ppcVar1;
  iterator iVar2;
  _Base_ptr p_Var3;
  mapped_type *pmVar4;
  _Rb_tree_header *p_Var5;
  bool bVar6;
  key_type local_34;
  
  ppcVar1 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&(this->Properties).
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,&local_34);
  p_Var3 = ((*ppcVar1)->LockedResources)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &((*ppcVar1)->LockedResources)._M_t._M_impl.super__Rb_tree_header;
  bVar6 = (_Rb_tree_header *)p_Var3 == p_Var5;
  if (!bVar6) {
    do {
      iVar2 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(this->LockedResources)._M_t,(key_type *)(p_Var3 + 1));
      if ((_Rb_tree_header *)iVar2._M_node !=
          &(this->LockedResources)._M_t._M_impl.super__Rb_tree_header) {
        if (!bVar6) goto LAB_001dc5ef;
        break;
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      bVar6 = (_Rb_tree_header *)p_Var3 == p_Var5;
    } while (!bVar6);
  }
  pmVar4 = std::
           map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
           ::operator[](&(this->Tests).
                         super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                        ,&local_34);
  if ((pmVar4->super_set<int,_std::less<int>,_std::allocator<int>_>)._M_t._M_impl.
      super__Rb_tree_header._M_node_count == 0) {
    bVar6 = StartTestProcess(this,test);
  }
  else {
LAB_001dc5ef:
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool cmCTestMultiProcessHandler::StartTest(int test)
{
  // Check for locked resources
  for (std::string const& i : this->Properties[test]->LockedResources) {
    if (this->LockedResources.find(i) != this->LockedResources.end()) {
      return false;
    }
  }

  // if there are no depends left then run this test
  if (this->Tests[test].empty()) {
    return this->StartTestProcess(test);
  }
  // This test was not able to start because it is waiting
  // on depends to run
  return false;
}